

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

string * tcb::unicode::
         to_utf_string<char,std::istreambuf_iterator<char,std::char_traits<char>>,std::istreambuf_iterator<char,std::char_traits<char>>,char>
                   (istreambuf_iterator<char,_std::char_traits<char>_> first,
                   istreambuf_iterator<char,_std::char_traits<char>_> last)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  string *this;
  undefined4 in_R8D;
  istreambuf_iterator<char,_std::char_traits<char>_> first_00;
  istreambuf_iterator<char,_std::char_traits<char>_> last_00;
  istreambuf_iterator<char,_std::char_traits<char>_> last_local;
  istreambuf_iterator<char,_std::char_traits<char>_> first_local;
  string_type *output;
  
  this = (string *)first._M_sbuf;
  std::__cxx11::string::string(this);
  out = std::back_inserter<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  first_00._M_c = (int)last._M_sbuf;
  first_00._M_sbuf = (streambuf_type *)first._8_8_;
  last_00._M_c = in_R8D;
  last_00._M_sbuf = (streambuf_type *)last._8_8_;
  first_00._12_4_ = 0;
  last_00._12_4_ = 0;
  utf_convert<char,std::istreambuf_iterator<char,std::char_traits<char>>,std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>,char>
            (first_00,last_00,out);
  return this;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}